

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsSimpleTextItem::paint
          (QGraphicsSimpleTextItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  QGraphicsItemPrivate *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  QPen p;
  QStackTextEngine engine;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  undefined1 *local_2a30;
  QTextLayout local_2a28;
  QArrayData *local_2a20;
  qreal local_2a18;
  qreal local_2a10;
  undefined1 local_2a08 [8];
  undefined1 *puStack_2a00;
  undefined1 *local_29f8;
  QStackTextEngine local_29f0 [264];
  LayoutData local_28e8 [10384];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.d_ptr.d;
  QPainter::setFont((QFont *)painter);
  local_2a20 = (QArrayData *)pQVar1[1].childrenBoundingRect.w;
  local_2a18 = pQVar1[1].childrenBoundingRect.h;
  local_2a10 = pQVar1[1].needsRepaint.xp;
  if (local_2a20 != (QArrayData *)0x0) {
    LOCK();
    (local_2a20->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2a20->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::replace((QChar)(char16_t)&local_2a20,(QChar)0xa,0x2028);
  QStackTextEngine::QStackTextEngine
            (local_29f0,(QString *)&local_2a20,(QFont *)&pQVar1[1].needsRepaint.yp);
  local_2a30 = &DAT_aaaaaaaaaaaaaaaa;
  local_2a28.d = (QTextEngine *)local_29f0;
  QPen::QPen((QPen *)&local_2a30);
  QPen::setBrush((QBrush *)&local_2a30);
  QPainter::setPen((QPen *)painter);
  iVar2 = QPen::style();
  if ((iVar2 == 0) && (*(int *)((long)pQVar1[1]._vptr_QGraphicsItemPrivate + 4) == 1)) {
    QPainter::setBrush((BrushStyle)painter);
  }
  else {
    local_29f8 = &DAT_aaaaaaaaaaaaaaaa;
    local_2a08 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    puStack_2a00 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&puStack_2a00);
    local_2a08 = (undefined1  [8])((ulong)local_2a08 & 0xffffffff00000000);
    QTextLayout::text();
    local_2a08._4_4_ = local_58._16_4_;
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    QPen::operator_cast_to_QVariant((QVariant *)&local_58,(QPen *)&pQVar1[1].extras);
    QTextFormat::setProperty((int)(QTextFormat *)&puStack_2a00,(QVariant *)0x2022);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QList<QTextLayout::FormatRange>::QList
              ((QList<QTextLayout::FormatRange> *)&local_58,1,(parameter_type)local_2a08);
    QTextLayout::setFormats((QList_conflict *)&local_2a28);
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
              ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_58);
    QTextFormat::~QTextFormat((QTextFormat *)&puStack_2a00);
  }
  setupTextLayout((QRectF *)&local_58,&local_2a28);
  local_2a48 = 0;
  uStack_2a40 = 0;
  local_2a08 = (undefined1  [8])0x0;
  puStack_2a00 = (undefined1 *)0x0;
  local_29f8 = (undefined1 *)0x0;
  local_58._16_8_ = 0;
  uStack_40 = 0;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  QTextLayout::draw((QPainter *)&local_2a28,(QPointF *)painter,(QList_conflict *)&local_2a48,
                    (QRectF *)local_2a08);
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
            ((QArrayDataPointer<QTextLayout::FormatRange> *)local_2a08);
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8100) != 0) {
    qt_graphicsItem_highlightSelected((QGraphicsItem *)this,painter,option);
  }
  QPen::~QPen((QPen *)&local_2a30);
  QTextLayout::~QTextLayout(&local_2a28);
  QTextEngine::LayoutData::~LayoutData(local_28e8);
  QTextEngine::~QTextEngine((QTextEngine *)local_29f0);
  if (local_2a20 != (QArrayData *)0x0) {
    LOCK();
    (local_2a20->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2a20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2a20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2a20,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSimpleTextItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option, QWidget *widget)
{
    Q_UNUSED(widget);
    Q_D(QGraphicsSimpleTextItem);

    painter->setFont(d->font);

    QString tmp = d->text;
    tmp.replace(u'\n', QChar::LineSeparator);
    Q_DECL_UNINITIALIZED QStackTextEngine engine(tmp, d->font);
    QTextLayout layout(&engine);

    QPen p;
    p.setBrush(d->brush);
    painter->setPen(p);
    if (d->pen.style() == Qt::NoPen && d->brush.style() == Qt::SolidPattern) {
        painter->setBrush(Qt::NoBrush);
    } else {
        QTextLayout::FormatRange range;
        range.start = 0;
        range.length = layout.text().size();
        range.format.setTextOutline(d->pen);
        layout.setFormats(QList<QTextLayout::FormatRange>(1, range));
    }

    setupTextLayout(&layout);
    layout.draw(painter, QPointF(0, 0));

    if (option->state & (QStyle::State_Selected | QStyle::State_HasFocus))
        qt_graphicsItem_highlightSelected(this, painter, option);
}